

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.c
# Opt level: O0

void TestSuite_Scanner(void)

{
  bool bVar1;
  _Bool _Var2;
  sysbvm_tokenKind_t sVar3;
  sysbvm_char32_t sVar4;
  sysbvm_tuple_t sVar5;
  size_t sVar6;
  sysbvm_tuple_t sVar7;
  sysbvm_tuple_t sVar8;
  char *pcVar9;
  sysbvm_tuple_t tokenList_26;
  int Delimiters_isRunning;
  sysbvm_tuple_t tokenList_25;
  int StringSymbol_isRunning;
  sysbvm_tuple_t tokenList_24;
  int String_isRunning;
  sysbvm_tuple_t tokenList_23;
  int Character_isRunning;
  sysbvm_tuple_t tokenList_22;
  int Float_isRunning;
  sysbvm_tuple_t tokenList_21;
  int IntegerWithRadix2_isRunning;
  sysbvm_tuple_t tokenList_20;
  int IntegerWithRadix_isRunning;
  sysbvm_tuple_t tokenList_19;
  int Integer2_isRunning;
  sysbvm_tuple_t tokenList_18;
  int Integer_isRunning;
  sysbvm_tuple_t tokenList_17;
  int OperatorSymbol2_isRunning;
  sysbvm_tuple_t tokenList_16;
  int OperatorSymbol_isRunning;
  sysbvm_tuple_t tokenList_15;
  int IdentifierSymbol2_isRunning;
  sysbvm_tuple_t tokenList_14;
  int IdentifierSymbol_isRunning;
  sysbvm_tuple_t tokenList_13;
  int ScopedMultiKeyword_isRunning;
  sysbvm_tuple_t tokenList_12;
  int MultiKeyword_isRunning;
  sysbvm_tuple_t tokenList_11;
  int ScopedKeyword_isRunning;
  sysbvm_tuple_t tokenList_10;
  int Keyword_isRunning;
  sysbvm_tuple_t tokenList_9;
  int ScopedOperator2_isRunning;
  sysbvm_tuple_t tokenList_8;
  int ScopedOperator_isRunning;
  sysbvm_tuple_t tokenList_7;
  int Operator2_isRunning;
  sysbvm_tuple_t tokenList_6;
  int Operator_isRunning;
  sysbvm_tuple_t tokenList_5;
  int ScopedIdentifier2_isRunning;
  sysbvm_tuple_t tokenList_4;
  int ScopedIdentifier_isRunning;
  sysbvm_tuple_t tokenList_3;
  int Identifier_isRunning;
  sysbvm_tuple_t tokenList_2;
  int MultiLineComment_isRunning;
  sysbvm_tuple_t tokenList_1;
  int SingleLineComment_isRunning;
  sysbvm_tuple_t tokenList;
  int EmptyString_isRunning;
  
  sysbvm_test_currentTestCaseName = "EmptyString";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- EmptyString...");
  TuuvmCore_initialize();
  bVar1 = true;
  while (bVar1) {
    sVar5 = sysbvm_scanner_scanCString(sysbvm_test_context,"","test","tlisp");
    sVar6 = sysbvm_arraySlice_getSize(sVar5);
    if (sVar6 != 0) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:12: Obtained value is not equal to 0\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    bVar1 = false;
    TuuvmCore_shutdown();
    pcVar9 = " Success\n";
    if (sysbvm_test_currentHasError != 0) {
      pcVar9 = "";
    }
    printf(pcVar9);
  }
  sysbvm_test_currentTestCaseName = "SingleLineComment";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- SingleLineComment...");
  TuuvmCore_initialize();
  bVar1 = true;
  while (bVar1) {
    sVar5 = sysbvm_scanner_scanCString(sysbvm_test_context,"## Single line comment","test","tlisp");
    sVar6 = sysbvm_arraySlice_getSize(sVar5);
    if (sVar6 != 0) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:18: Obtained value is not equal to 0\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    bVar1 = false;
    TuuvmCore_shutdown();
    pcVar9 = " Success\n";
    if (sysbvm_test_currentHasError != 0) {
      pcVar9 = "";
    }
    printf(pcVar9);
  }
  sysbvm_test_currentTestCaseName = "MultiLineComment";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- MultiLineComment...");
  TuuvmCore_initialize();
  bVar1 = true;
  while (bVar1) {
    sVar5 = sysbvm_scanner_scanCString
                      (sysbvm_test_context,"#*\n* Multi line comment\n*\n*#","test","tlisp");
    sVar6 = sysbvm_arraySlice_getSize(sVar5);
    if (sVar6 != 0) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:24: Obtained value is not equal to 0\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    bVar1 = false;
    TuuvmCore_shutdown();
    pcVar9 = " Success\n";
    if (sysbvm_test_currentHasError != 0) {
      pcVar9 = "";
    }
    printf(pcVar9);
  }
  sysbvm_test_currentTestCaseName = "Identifier";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- Identifier...");
  TuuvmCore_initialize();
  bVar1 = true;
  while (bVar1) {
    sVar5 = sysbvm_scanner_scanCString(sysbvm_test_context,"helloWorld1234","test","tlisp");
    sVar6 = sysbvm_arraySlice_getSize(sVar5);
    if (sVar6 != 1) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:30: Obtained value is not equal to 1\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_arraySlice_at(sVar5,0);
    sVar3 = sysbvm_token_getKind(sVar7);
    if (sVar3 != SYSBVM_TOKEN_KIND_IDENTIFIER) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:31: Obtained value is not equal to SYSBVM_TOKEN_KIND_IDENTIFIER\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_symbol_internWithCString(sysbvm_test_context,"helloWorld1234");
    sVar5 = sysbvm_arraySlice_at(sVar5,0);
    sVar5 = sysbvm_token_getValue(sVar5);
    if (sVar7 != sVar5) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:32: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"helloWorld1234\")\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    bVar1 = false;
    TuuvmCore_shutdown();
    pcVar9 = " Success\n";
    if (sysbvm_test_currentHasError != 0) {
      pcVar9 = "";
    }
    printf(pcVar9);
  }
  sysbvm_test_currentTestCaseName = "ScopedIdentifier";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- ScopedIdentifier...");
  TuuvmCore_initialize();
  bVar1 = true;
  while (bVar1) {
    sVar5 = sysbvm_scanner_scanCString(sysbvm_test_context,"Scope::helloWorld1234","test","tlisp");
    sVar6 = sysbvm_arraySlice_getSize(sVar5);
    if (sVar6 != 1) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:38: Obtained value is not equal to 1\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_arraySlice_at(sVar5,0);
    sVar3 = sysbvm_token_getKind(sVar7);
    if (sVar3 != SYSBVM_TOKEN_KIND_IDENTIFIER) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:39: Obtained value is not equal to SYSBVM_TOKEN_KIND_IDENTIFIER\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_symbol_internWithCString(sysbvm_test_context,"Scope::helloWorld1234");
    sVar5 = sysbvm_arraySlice_at(sVar5,0);
    sVar5 = sysbvm_token_getValue(sVar5);
    if (sVar7 != sVar5) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:40: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"Scope::helloWorld1234\")\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    bVar1 = false;
    TuuvmCore_shutdown();
    pcVar9 = " Success\n";
    if (sysbvm_test_currentHasError != 0) {
      pcVar9 = "";
    }
    printf(pcVar9);
  }
  sysbvm_test_currentTestCaseName = "ScopedIdentifier2";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- ScopedIdentifier2...");
  TuuvmCore_initialize();
  bVar1 = true;
  while (bVar1) {
    sVar5 = sysbvm_scanner_scanCString
                      (sysbvm_test_context,"Scope::SubScope::helloWorld1234","test","tlisp");
    sVar6 = sysbvm_arraySlice_getSize(sVar5);
    if (sVar6 != 1) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:46: Obtained value is not equal to 1\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_arraySlice_at(sVar5,0);
    sVar3 = sysbvm_token_getKind(sVar7);
    if (sVar3 != SYSBVM_TOKEN_KIND_IDENTIFIER) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:47: Obtained value is not equal to SYSBVM_TOKEN_KIND_IDENTIFIER\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_symbol_internWithCString(sysbvm_test_context,"Scope::SubScope::helloWorld1234");
    sVar5 = sysbvm_arraySlice_at(sVar5,0);
    sVar5 = sysbvm_token_getValue(sVar5);
    if (sVar7 != sVar5) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:48: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"Scope::SubScope::helloWorld1234\")\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    bVar1 = false;
    TuuvmCore_shutdown();
    pcVar9 = " Success\n";
    if (sysbvm_test_currentHasError != 0) {
      pcVar9 = "";
    }
    printf(pcVar9);
  }
  sysbvm_test_currentTestCaseName = "Operator";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- Operator...");
  TuuvmCore_initialize();
  bVar1 = true;
  while (bVar1) {
    sVar5 = sysbvm_scanner_scanCString(sysbvm_test_context,"+","test","tlisp");
    sVar6 = sysbvm_arraySlice_getSize(sVar5);
    if (sVar6 != 1) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:54: Obtained value is not equal to 1\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_arraySlice_at(sVar5,0);
    sVar3 = sysbvm_token_getKind(sVar7);
    if (sVar3 != SYSBVM_TOKEN_KIND_OPERATOR) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:55: Obtained value is not equal to SYSBVM_TOKEN_KIND_OPERATOR\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_symbol_internWithCString(sysbvm_test_context,"+");
    sVar5 = sysbvm_arraySlice_at(sVar5,0);
    sVar5 = sysbvm_token_getValue(sVar5);
    if (sVar7 != sVar5) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:56: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"+\")\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    bVar1 = false;
    TuuvmCore_shutdown();
    pcVar9 = " Success\n";
    if (sysbvm_test_currentHasError != 0) {
      pcVar9 = "";
    }
    printf(pcVar9);
  }
  sysbvm_test_currentTestCaseName = "Operator2";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- Operator2...");
  TuuvmCore_initialize();
  bVar1 = true;
  while (bVar1) {
    sVar5 = sysbvm_scanner_scanCString(sysbvm_test_context,"||","test","tlisp");
    sVar6 = sysbvm_arraySlice_getSize(sVar5);
    if (sVar6 != 1) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:62: Obtained value is not equal to 1\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_arraySlice_at(sVar5,0);
    sVar3 = sysbvm_token_getKind(sVar7);
    if (sVar3 != SYSBVM_TOKEN_KIND_OPERATOR) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:63: Obtained value is not equal to SYSBVM_TOKEN_KIND_OPERATOR\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_symbol_internWithCString(sysbvm_test_context,"||");
    sVar5 = sysbvm_arraySlice_at(sVar5,0);
    sVar5 = sysbvm_token_getValue(sVar5);
    if (sVar7 != sVar5) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:64: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"||\")\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    bVar1 = false;
    TuuvmCore_shutdown();
    pcVar9 = " Success\n";
    if (sysbvm_test_currentHasError != 0) {
      pcVar9 = "";
    }
    printf(pcVar9);
  }
  sysbvm_test_currentTestCaseName = "ScopedOperator";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- ScopedOperator...");
  TuuvmCore_initialize();
  bVar1 = true;
  while (bVar1) {
    sVar5 = sysbvm_scanner_scanCString(sysbvm_test_context,"Scope::+","test","tlisp");
    sVar6 = sysbvm_arraySlice_getSize(sVar5);
    if (sVar6 != 1) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:70: Obtained value is not equal to 1\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_arraySlice_at(sVar5,0);
    sVar3 = sysbvm_token_getKind(sVar7);
    if (sVar3 != SYSBVM_TOKEN_KIND_OPERATOR) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:71: Obtained value is not equal to SYSBVM_TOKEN_KIND_OPERATOR\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_symbol_internWithCString(sysbvm_test_context,"Scope::+");
    sVar5 = sysbvm_arraySlice_at(sVar5,0);
    sVar5 = sysbvm_token_getValue(sVar5);
    if (sVar7 != sVar5) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:72: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"Scope::+\")\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    bVar1 = false;
    TuuvmCore_shutdown();
    pcVar9 = " Success\n";
    if (sysbvm_test_currentHasError != 0) {
      pcVar9 = "";
    }
    printf(pcVar9);
  }
  sysbvm_test_currentTestCaseName = "ScopedOperator2";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- ScopedOperator2...");
  TuuvmCore_initialize();
  bVar1 = true;
  while (bVar1) {
    sVar5 = sysbvm_scanner_scanCString(sysbvm_test_context,"Scope::SubScope::+","test","tlisp");
    sVar6 = sysbvm_arraySlice_getSize(sVar5);
    if (sVar6 != 1) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:78: Obtained value is not equal to 1\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_arraySlice_at(sVar5,0);
    sVar3 = sysbvm_token_getKind(sVar7);
    if (sVar3 != SYSBVM_TOKEN_KIND_OPERATOR) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:79: Obtained value is not equal to SYSBVM_TOKEN_KIND_OPERATOR\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_symbol_internWithCString(sysbvm_test_context,"Scope::SubScope::+");
    sVar5 = sysbvm_arraySlice_at(sVar5,0);
    sVar5 = sysbvm_token_getValue(sVar5);
    if (sVar7 != sVar5) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:80: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"Scope::SubScope::+\")\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    bVar1 = false;
    TuuvmCore_shutdown();
    pcVar9 = " Success\n";
    if (sysbvm_test_currentHasError != 0) {
      pcVar9 = "";
    }
    printf(pcVar9);
  }
  sysbvm_test_currentTestCaseName = "Keyword";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- Keyword...");
  TuuvmCore_initialize();
  bVar1 = true;
  while (bVar1) {
    sVar5 = sysbvm_scanner_scanCString(sysbvm_test_context,"test:","test","tlisp");
    sVar6 = sysbvm_arraySlice_getSize(sVar5);
    if (sVar6 != 1) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:86: Obtained value is not equal to 1\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_arraySlice_at(sVar5,0);
    sVar3 = sysbvm_token_getKind(sVar7);
    if (sVar3 != SYSBVM_TOKEN_KIND_KEYWORD) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:87: Obtained value is not equal to SYSBVM_TOKEN_KIND_KEYWORD\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_symbol_internWithCString(sysbvm_test_context,"test:");
    sVar5 = sysbvm_arraySlice_at(sVar5,0);
    sVar5 = sysbvm_token_getValue(sVar5);
    if (sVar7 != sVar5) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:88: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"test:\")\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    bVar1 = false;
    TuuvmCore_shutdown();
    pcVar9 = " Success\n";
    if (sysbvm_test_currentHasError != 0) {
      pcVar9 = "";
    }
    printf(pcVar9);
  }
  sysbvm_test_currentTestCaseName = "ScopedKeyword";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- ScopedKeyword...");
  TuuvmCore_initialize();
  bVar1 = true;
  while (bVar1) {
    sVar5 = sysbvm_scanner_scanCString(sysbvm_test_context,"Scope::test:","test","tlisp");
    sVar6 = sysbvm_arraySlice_getSize(sVar5);
    if (sVar6 != 1) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:94: Obtained value is not equal to 1\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_arraySlice_at(sVar5,0);
    sVar3 = sysbvm_token_getKind(sVar7);
    if (sVar3 != SYSBVM_TOKEN_KIND_KEYWORD) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:95: Obtained value is not equal to SYSBVM_TOKEN_KIND_KEYWORD\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_symbol_internWithCString(sysbvm_test_context,"Scope::test:");
    sVar5 = sysbvm_arraySlice_at(sVar5,0);
    sVar5 = sysbvm_token_getValue(sVar5);
    if (sVar7 != sVar5) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:96: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"Scope::test:\")\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    bVar1 = false;
    TuuvmCore_shutdown();
    pcVar9 = " Success\n";
    if (sysbvm_test_currentHasError != 0) {
      pcVar9 = "";
    }
    printf(pcVar9);
  }
  sysbvm_test_currentTestCaseName = "MultiKeyword";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- MultiKeyword...");
  TuuvmCore_initialize();
  bVar1 = true;
  while (bVar1) {
    sVar5 = sysbvm_scanner_scanCString(sysbvm_test_context,"test:second:","test","tlisp");
    sVar6 = sysbvm_arraySlice_getSize(sVar5);
    if (sVar6 != 1) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:102: Obtained value is not equal to 1\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_arraySlice_at(sVar5,0);
    sVar3 = sysbvm_token_getKind(sVar7);
    if (sVar3 != SYSBVM_TOKEN_KIND_MULTI_KEYWORD) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:103: Obtained value is not equal to SYSBVM_TOKEN_KIND_MULTI_KEYWORD\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_symbol_internWithCString(sysbvm_test_context,"test:second:");
    sVar5 = sysbvm_arraySlice_at(sVar5,0);
    sVar5 = sysbvm_token_getValue(sVar5);
    if (sVar7 != sVar5) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:104: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"test:second:\")\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    bVar1 = false;
    TuuvmCore_shutdown();
    pcVar9 = " Success\n";
    if (sysbvm_test_currentHasError != 0) {
      pcVar9 = "";
    }
    printf(pcVar9);
  }
  sysbvm_test_currentTestCaseName = "ScopedMultiKeyword";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- ScopedMultiKeyword...");
  TuuvmCore_initialize();
  bVar1 = true;
  while (bVar1) {
    sVar5 = sysbvm_scanner_scanCString(sysbvm_test_context,"Scope::test:second:","test","tlisp");
    sVar6 = sysbvm_arraySlice_getSize(sVar5);
    if (sVar6 != 1) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:110: Obtained value is not equal to 1\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_arraySlice_at(sVar5,0);
    sVar3 = sysbvm_token_getKind(sVar7);
    if (sVar3 != SYSBVM_TOKEN_KIND_MULTI_KEYWORD) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:111: Obtained value is not equal to SYSBVM_TOKEN_KIND_MULTI_KEYWORD\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_symbol_internWithCString(sysbvm_test_context,"Scope::test:second:");
    sVar5 = sysbvm_arraySlice_at(sVar5,0);
    sVar5 = sysbvm_token_getValue(sVar5);
    if (sVar7 != sVar5) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:112: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"Scope::test:second:\")\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    bVar1 = false;
    TuuvmCore_shutdown();
    pcVar9 = " Success\n";
    if (sysbvm_test_currentHasError != 0) {
      pcVar9 = "";
    }
    printf(pcVar9);
  }
  sysbvm_test_currentTestCaseName = "IdentifierSymbol";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- IdentifierSymbol...");
  TuuvmCore_initialize();
  bVar1 = true;
  while (bVar1) {
    sVar5 = sysbvm_scanner_scanCString(sysbvm_test_context,"#helloWorld1234","test","tlisp");
    sVar6 = sysbvm_arraySlice_getSize(sVar5);
    if (sVar6 != 1) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:118: Obtained value is not equal to 1\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_arraySlice_at(sVar5,0);
    sVar3 = sysbvm_token_getKind(sVar7);
    if (sVar3 != SYSBVM_TOKEN_KIND_SYMBOL) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:119: Obtained value is not equal to SYSBVM_TOKEN_KIND_SYMBOL\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_symbol_internWithCString(sysbvm_test_context,"helloWorld1234");
    sVar5 = sysbvm_arraySlice_at(sVar5,0);
    sVar5 = sysbvm_token_getValue(sVar5);
    if (sVar7 != sVar5) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:120: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"helloWorld1234\")\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    bVar1 = false;
    TuuvmCore_shutdown();
    pcVar9 = " Success\n";
    if (sysbvm_test_currentHasError != 0) {
      pcVar9 = "";
    }
    printf(pcVar9);
  }
  sysbvm_test_currentTestCaseName = "IdentifierSymbol2";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- IdentifierSymbol2...");
  TuuvmCore_initialize();
  bVar1 = true;
  while (bVar1) {
    sVar5 = sysbvm_scanner_scanCString(sysbvm_test_context,"#Scope::helloWorld1234","test","tlisp");
    sVar6 = sysbvm_arraySlice_getSize(sVar5);
    if (sVar6 != 1) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:126: Obtained value is not equal to 1\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_arraySlice_at(sVar5,0);
    sVar3 = sysbvm_token_getKind(sVar7);
    if (sVar3 != SYSBVM_TOKEN_KIND_SYMBOL) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:127: Obtained value is not equal to SYSBVM_TOKEN_KIND_SYMBOL\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_symbol_internWithCString(sysbvm_test_context,"Scope::helloWorld1234");
    sVar5 = sysbvm_arraySlice_at(sVar5,0);
    sVar5 = sysbvm_token_getValue(sVar5);
    if (sVar7 != sVar5) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:128: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"Scope::helloWorld1234\")\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    bVar1 = false;
    TuuvmCore_shutdown();
    pcVar9 = " Success\n";
    if (sysbvm_test_currentHasError != 0) {
      pcVar9 = "";
    }
    printf(pcVar9);
  }
  sysbvm_test_currentTestCaseName = "OperatorSymbol";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- OperatorSymbol...");
  TuuvmCore_initialize();
  bVar1 = true;
  while (bVar1) {
    sVar5 = sysbvm_scanner_scanCString(sysbvm_test_context,"#+","test","tlisp");
    sVar6 = sysbvm_arraySlice_getSize(sVar5);
    if (sVar6 != 1) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:134: Obtained value is not equal to 1\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_arraySlice_at(sVar5,0);
    sVar3 = sysbvm_token_getKind(sVar7);
    if (sVar3 != SYSBVM_TOKEN_KIND_SYMBOL) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:135: Obtained value is not equal to SYSBVM_TOKEN_KIND_SYMBOL\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_symbol_internWithCString(sysbvm_test_context,"+");
    sVar5 = sysbvm_arraySlice_at(sVar5,0);
    sVar5 = sysbvm_token_getValue(sVar5);
    if (sVar7 != sVar5) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:136: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"+\")\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    bVar1 = false;
    TuuvmCore_shutdown();
    pcVar9 = " Success\n";
    if (sysbvm_test_currentHasError != 0) {
      pcVar9 = "";
    }
    printf(pcVar9);
  }
  sysbvm_test_currentTestCaseName = "OperatorSymbol2";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- OperatorSymbol2...");
  TuuvmCore_initialize();
  bVar1 = true;
  while (bVar1) {
    sVar5 = sysbvm_scanner_scanCString(sysbvm_test_context,"#Scope::+","test","tlisp");
    sVar6 = sysbvm_arraySlice_getSize(sVar5);
    if (sVar6 != 1) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:142: Obtained value is not equal to 1\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_arraySlice_at(sVar5,0);
    sVar3 = sysbvm_token_getKind(sVar7);
    if (sVar3 != SYSBVM_TOKEN_KIND_SYMBOL) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:143: Obtained value is not equal to SYSBVM_TOKEN_KIND_SYMBOL\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_symbol_internWithCString(sysbvm_test_context,"Scope::+");
    sVar5 = sysbvm_arraySlice_at(sVar5,0);
    sVar5 = sysbvm_token_getValue(sVar5);
    if (sVar7 != sVar5) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:144: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"Scope::+\")\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    bVar1 = false;
    TuuvmCore_shutdown();
    pcVar9 = " Success\n";
    if (sysbvm_test_currentHasError != 0) {
      pcVar9 = "";
    }
    printf(pcVar9);
  }
  sysbvm_test_currentTestCaseName = "Integer";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- Integer...");
  TuuvmCore_initialize();
  bVar1 = true;
  while (bVar1) {
    sVar5 = sysbvm_scanner_scanCString(sysbvm_test_context,"12345","test","tlisp");
    sVar6 = sysbvm_arraySlice_getSize(sVar5);
    if (sVar6 != 1) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:150: Obtained value is not equal to 1\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar5 = sysbvm_arraySlice_at(sVar5,0);
    sVar3 = sysbvm_token_getKind(sVar5);
    if (sVar3 != SYSBVM_TOKEN_KIND_INTEGER) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:151: Obtained value is not equal to SYSBVM_TOKEN_KIND_INTEGER\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    bVar1 = false;
    TuuvmCore_shutdown();
    pcVar9 = " Success\n";
    if (sysbvm_test_currentHasError != 0) {
      pcVar9 = "";
    }
    printf(pcVar9);
  }
  sysbvm_test_currentTestCaseName = "Integer2";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- Integer2...");
  TuuvmCore_initialize();
  bVar1 = true;
  while (bVar1) {
    sVar5 = sysbvm_scanner_scanCString(sysbvm_test_context,"12_345","test","tlisp");
    sVar6 = sysbvm_arraySlice_getSize(sVar5);
    if (sVar6 != 1) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:158: Obtained value is not equal to 1\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar5 = sysbvm_arraySlice_at(sVar5,0);
    sVar3 = sysbvm_token_getKind(sVar5);
    if (sVar3 != SYSBVM_TOKEN_KIND_INTEGER) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:159: Obtained value is not equal to SYSBVM_TOKEN_KIND_INTEGER\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    bVar1 = false;
    TuuvmCore_shutdown();
    pcVar9 = " Success\n";
    if (sysbvm_test_currentHasError != 0) {
      pcVar9 = "";
    }
    printf(pcVar9);
  }
  sysbvm_test_currentTestCaseName = "IntegerWithRadix";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- IntegerWithRadix...");
  TuuvmCore_initialize();
  bVar1 = true;
  while (bVar1) {
    sVar5 = sysbvm_scanner_scanCString(sysbvm_test_context,"16rFF00","test","tlisp");
    sVar6 = sysbvm_arraySlice_getSize(sVar5);
    if (sVar6 != 1) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:165: Obtained value is not equal to 1\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar5 = sysbvm_arraySlice_at(sVar5,0);
    sVar3 = sysbvm_token_getKind(sVar5);
    if (sVar3 != SYSBVM_TOKEN_KIND_INTEGER) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:166: Obtained value is not equal to SYSBVM_TOKEN_KIND_INTEGER\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    bVar1 = false;
    TuuvmCore_shutdown();
    pcVar9 = " Success\n";
    if (sysbvm_test_currentHasError != 0) {
      pcVar9 = "";
    }
    printf(pcVar9);
  }
  sysbvm_test_currentTestCaseName = "IntegerWithRadix2";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- IntegerWithRadix2...");
  TuuvmCore_initialize();
  bVar1 = true;
  while (bVar1) {
    sVar5 = sysbvm_scanner_scanCString(sysbvm_test_context,"16rFF_00","test","tlisp");
    sVar6 = sysbvm_arraySlice_getSize(sVar5);
    if (sVar6 != 1) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:172: Obtained value is not equal to 1\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar5 = sysbvm_arraySlice_at(sVar5,0);
    sVar3 = sysbvm_token_getKind(sVar5);
    if (sVar3 != SYSBVM_TOKEN_KIND_INTEGER) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:173: Obtained value is not equal to SYSBVM_TOKEN_KIND_INTEGER\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    bVar1 = false;
    TuuvmCore_shutdown();
    pcVar9 = " Success\n";
    if (sysbvm_test_currentHasError != 0) {
      pcVar9 = "";
    }
    printf(pcVar9);
  }
  sysbvm_test_currentTestCaseName = "Float";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- Float...");
  TuuvmCore_initialize();
  bVar1 = true;
  while (bVar1) {
    sVar5 = sysbvm_scanner_scanCString(sysbvm_test_context,"12345.0","test","tlisp");
    sVar6 = sysbvm_arraySlice_getSize(sVar5);
    if (sVar6 != 1) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:179: Obtained value is not equal to 1\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar5 = sysbvm_arraySlice_at(sVar5,0);
    sVar3 = sysbvm_token_getKind(sVar5);
    if (sVar3 != SYSBVM_TOKEN_KIND_FLOAT) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:180: Obtained value is not equal to SYSBVM_TOKEN_KIND_FLOAT\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    bVar1 = false;
    TuuvmCore_shutdown();
    pcVar9 = " Success\n";
    if (sysbvm_test_currentHasError != 0) {
      pcVar9 = "";
    }
    printf(pcVar9);
  }
  sysbvm_test_currentTestCaseName = "Character";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- Character...");
  TuuvmCore_initialize();
  bVar1 = true;
  while (bVar1) {
    sVar5 = sysbvm_scanner_scanCString(sysbvm_test_context,"\'T\'","test","tlisp");
    sVar6 = sysbvm_arraySlice_getSize(sVar5);
    if (sVar6 != 1) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:186: Obtained value is not equal to 1\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_arraySlice_at(sVar5,0);
    sVar3 = sysbvm_token_getKind(sVar7);
    if (sVar3 != SYSBVM_TOKEN_KIND_CHARACTER) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:187: Obtained value is not equal to SYSBVM_TOKEN_KIND_CHARACTER\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar5 = sysbvm_arraySlice_at(sVar5,0);
    sVar5 = sysbvm_token_getValue(sVar5);
    sVar4 = sysbvm_tuple_char32_decode(sVar5);
    if (sVar4 != 0x54) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:188: Obtained value is not equal to \'T\'\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    bVar1 = false;
    TuuvmCore_shutdown();
    pcVar9 = " Success\n";
    if (sysbvm_test_currentHasError != 0) {
      pcVar9 = "";
    }
    printf(pcVar9);
  }
  sysbvm_test_currentTestCaseName = "String";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- String...");
  TuuvmCore_initialize();
  bVar1 = true;
  while (bVar1) {
    sVar5 = sysbvm_scanner_scanCString
                      (sysbvm_test_context,"\"Hello \\\"World\\r\\n\"","test","tlisp");
    sVar6 = sysbvm_arraySlice_getSize(sVar5);
    if (sVar6 != 1) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:194: Obtained value is not equal to 1\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_arraySlice_at(sVar5,0);
    sVar3 = sysbvm_token_getKind(sVar7);
    if (sVar3 != SYSBVM_TOKEN_KIND_STRING) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:195: Obtained value is not equal to SYSBVM_TOKEN_KIND_STRING\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_string_createWithCString(sysbvm_test_context,"Hello \"World\r\n");
    sVar5 = sysbvm_arraySlice_at(sVar5,0);
    sVar5 = sysbvm_token_getValue(sVar5);
    _Var2 = sysbvm_string_equals(sVar7,sVar5);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:196: Assertion failure: sysbvm_string_equals(sysbvm_string_createWithCString(sysbvm_test_context, \"Hello \\\"World\\r\\n\"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 0)))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    bVar1 = false;
    TuuvmCore_shutdown();
    pcVar9 = " Success\n";
    if (sysbvm_test_currentHasError != 0) {
      pcVar9 = "";
    }
    printf(pcVar9);
  }
  sysbvm_test_currentTestCaseName = "StringSymbol";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- StringSymbol...");
  TuuvmCore_initialize();
  bVar1 = true;
  while (bVar1) {
    sVar5 = sysbvm_scanner_scanCString
                      (sysbvm_test_context,"#\"Hello \\\"World\\r\\n\"","test","tlisp");
    sVar6 = sysbvm_arraySlice_getSize(sVar5);
    if (sVar6 != 1) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:202: Obtained value is not equal to 1\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_arraySlice_at(sVar5,0);
    sVar3 = sysbvm_token_getKind(sVar7);
    if (sVar3 != SYSBVM_TOKEN_KIND_SYMBOL) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:203: Obtained value is not equal to SYSBVM_TOKEN_KIND_SYMBOL\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_string_createWithCString(sysbvm_test_context,"Hello \"World\r\n");
    sVar5 = sysbvm_arraySlice_at(sVar5,0);
    sVar5 = sysbvm_token_getValue(sVar5);
    _Var2 = sysbvm_string_equals(sVar7,sVar5);
    if (!_Var2) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:204: Assertion failure: sysbvm_string_equals(sysbvm_string_createWithCString(sysbvm_test_context, \"Hello \\\"World\\r\\n\"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 0)))\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    bVar1 = false;
    TuuvmCore_shutdown();
    pcVar9 = " Success\n";
    if (sysbvm_test_currentHasError != 0) {
      pcVar9 = "";
    }
    printf(pcVar9);
  }
  sysbvm_test_currentTestCaseName = "Delimiters";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- Delimiters...");
  TuuvmCore_initialize();
  bVar1 = true;
  while (bVar1) {
    sVar5 = sysbvm_scanner_scanCString
                      (sysbvm_test_context,"() [] {} : :: `\' `` `, `@ | .. ... ; * < >","test",
                       "tlisp");
    sVar6 = sysbvm_arraySlice_getSize(sVar5);
    if (sVar6 != 0x14) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:210: Obtained value is not equal to 20\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_arraySlice_at(sVar5,0);
    sVar3 = sysbvm_token_getKind(sVar7);
    if (sVar3 != SYSBVM_TOKEN_KIND_LPARENT) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:212: Obtained value is not equal to SYSBVM_TOKEN_KIND_LPARENT\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_symbol_internWithCString(sysbvm_test_context,"(");
    sVar8 = sysbvm_arraySlice_at(sVar5,0);
    sVar8 = sysbvm_token_getValue(sVar8);
    if (sVar7 != sVar8) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:213: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"(\")\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_arraySlice_at(sVar5,1);
    sVar3 = sysbvm_token_getKind(sVar7);
    if (sVar3 != SYSBVM_TOKEN_KIND_RPARENT) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:215: Obtained value is not equal to SYSBVM_TOKEN_KIND_RPARENT\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_symbol_internWithCString(sysbvm_test_context,")");
    sVar8 = sysbvm_arraySlice_at(sVar5,1);
    sVar8 = sysbvm_token_getValue(sVar8);
    if (sVar7 != sVar8) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:216: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \")\")\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_arraySlice_at(sVar5,2);
    sVar3 = sysbvm_token_getKind(sVar7);
    if (sVar3 != SYSBVM_TOKEN_KIND_LBRACKET) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:218: Obtained value is not equal to SYSBVM_TOKEN_KIND_LBRACKET\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_symbol_internWithCString(sysbvm_test_context,"[");
    sVar8 = sysbvm_arraySlice_at(sVar5,2);
    sVar8 = sysbvm_token_getValue(sVar8);
    if (sVar7 != sVar8) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:219: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"[\")\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_arraySlice_at(sVar5,3);
    sVar3 = sysbvm_token_getKind(sVar7);
    if (sVar3 != SYSBVM_TOKEN_KIND_RBRACKET) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:221: Obtained value is not equal to SYSBVM_TOKEN_KIND_RBRACKET\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_symbol_internWithCString(sysbvm_test_context,"]");
    sVar8 = sysbvm_arraySlice_at(sVar5,3);
    sVar8 = sysbvm_token_getValue(sVar8);
    if (sVar7 != sVar8) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:222: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"]\")\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_arraySlice_at(sVar5,4);
    sVar3 = sysbvm_token_getKind(sVar7);
    if (sVar3 != SYSBVM_TOKEN_KIND_LCBRACKET) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:224: Obtained value is not equal to SYSBVM_TOKEN_KIND_LCBRACKET\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_symbol_internWithCString(sysbvm_test_context,"{");
    sVar8 = sysbvm_arraySlice_at(sVar5,4);
    sVar8 = sysbvm_token_getValue(sVar8);
    if (sVar7 != sVar8) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:225: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"{\")\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_arraySlice_at(sVar5,5);
    sVar3 = sysbvm_token_getKind(sVar7);
    if (sVar3 != SYSBVM_TOKEN_KIND_RCBRACKET) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:227: Obtained value is not equal to SYSBVM_TOKEN_KIND_RCBRACKET\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_symbol_internWithCString(sysbvm_test_context,"}");
    sVar8 = sysbvm_arraySlice_at(sVar5,5);
    sVar8 = sysbvm_token_getValue(sVar8);
    if (sVar7 != sVar8) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:228: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"}\")\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_arraySlice_at(sVar5,6);
    sVar3 = sysbvm_token_getKind(sVar7);
    if (sVar3 != SYSBVM_TOKEN_KIND_COLON) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:230: Obtained value is not equal to SYSBVM_TOKEN_KIND_COLON\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_symbol_internWithCString(sysbvm_test_context,":");
    sVar8 = sysbvm_arraySlice_at(sVar5,6);
    sVar8 = sysbvm_token_getValue(sVar8);
    if (sVar7 != sVar8) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:231: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \":\")\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_arraySlice_at(sVar5,7);
    sVar3 = sysbvm_token_getKind(sVar7);
    if (sVar3 != SYSBVM_TOKEN_KIND_COLON_COLON) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:233: Obtained value is not equal to SYSBVM_TOKEN_KIND_COLON_COLON\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_symbol_internWithCString(sysbvm_test_context,"::");
    sVar8 = sysbvm_arraySlice_at(sVar5,7);
    sVar8 = sysbvm_token_getValue(sVar8);
    if (sVar7 != sVar8) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:234: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"::\")\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_arraySlice_at(sVar5,8);
    sVar3 = sysbvm_token_getKind(sVar7);
    if (sVar3 != SYSBVM_TOKEN_KIND_QUOTE) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:236: Obtained value is not equal to SYSBVM_TOKEN_KIND_QUOTE\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_symbol_internWithCString(sysbvm_test_context,"`\'");
    sVar8 = sysbvm_arraySlice_at(sVar5,8);
    sVar8 = sysbvm_token_getValue(sVar8);
    if (sVar7 != sVar8) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:237: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"`\'\")\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_arraySlice_at(sVar5,9);
    sVar3 = sysbvm_token_getKind(sVar7);
    if (sVar3 != SYSBVM_TOKEN_KIND_QUASI_QUOTE) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:239: Obtained value is not equal to SYSBVM_TOKEN_KIND_QUASI_QUOTE\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_symbol_internWithCString(sysbvm_test_context,"``");
    sVar8 = sysbvm_arraySlice_at(sVar5,9);
    sVar8 = sysbvm_token_getValue(sVar8);
    if (sVar7 != sVar8) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:240: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"``\")\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_arraySlice_at(sVar5,10);
    sVar3 = sysbvm_token_getKind(sVar7);
    if (sVar3 != SYSBVM_TOKEN_KIND_QUASI_UNQUOTE) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:242: Obtained value is not equal to SYSBVM_TOKEN_KIND_QUASI_UNQUOTE\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_symbol_internWithCString(sysbvm_test_context,"`,");
    sVar8 = sysbvm_arraySlice_at(sVar5,10);
    sVar8 = sysbvm_token_getValue(sVar8);
    if (sVar7 != sVar8) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:243: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"`,\")\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_arraySlice_at(sVar5,0xb);
    sVar3 = sysbvm_token_getKind(sVar7);
    if (sVar3 != SYSBVM_TOKEN_KIND_SPLICE) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:245: Obtained value is not equal to SYSBVM_TOKEN_KIND_SPLICE\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_symbol_internWithCString(sysbvm_test_context,"`@");
    sVar8 = sysbvm_arraySlice_at(sVar5,0xb);
    sVar8 = sysbvm_token_getValue(sVar8);
    if (sVar7 != sVar8) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:246: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"`@\")\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_arraySlice_at(sVar5,0xc);
    sVar3 = sysbvm_token_getKind(sVar7);
    if (sVar3 != SYSBVM_TOKEN_KIND_BAR) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:248: Obtained value is not equal to SYSBVM_TOKEN_KIND_BAR\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_symbol_internWithCString(sysbvm_test_context,"|");
    sVar8 = sysbvm_arraySlice_at(sVar5,0xc);
    sVar8 = sysbvm_token_getValue(sVar8);
    if (sVar7 != sVar8) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:249: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"|\")\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_arraySlice_at(sVar5,0xd);
    sVar3 = sysbvm_token_getKind(sVar7);
    if (sVar3 != SYSBVM_TOKEN_KIND_DOT) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:251: Obtained value is not equal to SYSBVM_TOKEN_KIND_DOT\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_symbol_internWithCString(sysbvm_test_context,".");
    sVar8 = sysbvm_arraySlice_at(sVar5,0xd);
    sVar8 = sysbvm_token_getValue(sVar8);
    if (sVar7 != sVar8) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:252: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \".\")\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_arraySlice_at(sVar5,0xe);
    sVar3 = sysbvm_token_getKind(sVar7);
    if (sVar3 != SYSBVM_TOKEN_KIND_DOT) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:254: Obtained value is not equal to SYSBVM_TOKEN_KIND_DOT\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_symbol_internWithCString(sysbvm_test_context,".");
    sVar8 = sysbvm_arraySlice_at(sVar5,0xe);
    sVar8 = sysbvm_token_getValue(sVar8);
    if (sVar7 != sVar8) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:255: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \".\")\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_arraySlice_at(sVar5,0xf);
    sVar3 = sysbvm_token_getKind(sVar7);
    if (sVar3 != SYSBVM_TOKEN_KIND_ELLIPSIS) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:257: Obtained value is not equal to SYSBVM_TOKEN_KIND_ELLIPSIS\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_symbol_internWithCString(sysbvm_test_context,"...");
    sVar8 = sysbvm_arraySlice_at(sVar5,0xf);
    sVar8 = sysbvm_token_getValue(sVar8);
    if (sVar7 != sVar8) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:258: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"...\")\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_arraySlice_at(sVar5,0x10);
    sVar3 = sysbvm_token_getKind(sVar7);
    if (sVar3 != SYSBVM_TOKEN_KIND_SEMICOLON) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:260: Obtained value is not equal to SYSBVM_TOKEN_KIND_SEMICOLON\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_symbol_internWithCString(sysbvm_test_context,";");
    sVar8 = sysbvm_arraySlice_at(sVar5,0x10);
    sVar8 = sysbvm_token_getValue(sVar8);
    if (sVar7 != sVar8) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:261: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \";\")\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_arraySlice_at(sVar5,0x11);
    sVar3 = sysbvm_token_getKind(sVar7);
    if (sVar3 != SYSBVM_TOKEN_KIND_STAR) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:263: Obtained value is not equal to SYSBVM_TOKEN_KIND_STAR\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_symbol_internWithCString(sysbvm_test_context,"*");
    sVar8 = sysbvm_arraySlice_at(sVar5,0x11);
    sVar8 = sysbvm_token_getValue(sVar8);
    if (sVar7 != sVar8) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:264: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"*\")\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_arraySlice_at(sVar5,0x12);
    sVar3 = sysbvm_token_getKind(sVar7);
    if (sVar3 != SYSBVM_TOKEN_KIND_LESS_THAN) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:266: Obtained value is not equal to SYSBVM_TOKEN_KIND_LESS_THAN\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_symbol_internWithCString(sysbvm_test_context,"<");
    sVar8 = sysbvm_arraySlice_at(sVar5,0x12);
    sVar8 = sysbvm_token_getValue(sVar8);
    if (sVar7 != sVar8) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:267: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \"<\")\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_arraySlice_at(sVar5,0x13);
    sVar3 = sysbvm_token_getKind(sVar7);
    if (sVar3 != SYSBVM_TOKEN_KIND_GREATER_THAN) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:269: Obtained value is not equal to SYSBVM_TOKEN_KIND_GREATER_THAN\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    sVar7 = sysbvm_symbol_internWithCString(sysbvm_test_context,">");
    sVar5 = sysbvm_arraySlice_at(sVar5,0x13);
    sVar5 = sysbvm_token_getValue(sVar5);
    if (sVar7 != sVar5) {
      if (sysbvm_test_currentHasError == 0) {
        printf("\n");
      }
      printf(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Scanner.c:270: Obtained value is not equal to sysbvm_symbol_internWithCString(sysbvm_test_context, \">\")\n"
            );
      if (sysbvm_test_currentHasError == 0) {
        sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
        sysbvm_test_currentHasError = 1;
      }
    }
    bVar1 = false;
    TuuvmCore_shutdown();
    pcVar9 = " Success\n";
    if (sysbvm_test_currentHasError != 0) {
      pcVar9 = "";
    }
    printf(pcVar9);
  }
  return;
}

Assistant:

TEST_SUITE(Scanner)
{
    TEST_CASE_WITH_FIXTURE(EmptyString, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "", "test", "tlisp");
        TEST_ASSERT_EQUALS(0, sysbvm_arraySlice_getSize(tokenList));
    }

    TEST_CASE_WITH_FIXTURE(SingleLineComment, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "## Single line comment", "test", "tlisp");
        TEST_ASSERT_EQUALS(0, sysbvm_arraySlice_getSize(tokenList));
    }

    TEST_CASE_WITH_FIXTURE(MultiLineComment, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "#*\n* Multi line comment\n*\n*#", "test", "tlisp");
        TEST_ASSERT_EQUALS(0, sysbvm_arraySlice_getSize(tokenList));
    }

    TEST_CASE_WITH_FIXTURE(Identifier, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "helloWorld1234", "test", "tlisp");
        TEST_ASSERT_EQUALS(1, sysbvm_arraySlice_getSize(tokenList));
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_IDENTIFIER, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "helloWorld1234"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 0)));
    }

    TEST_CASE_WITH_FIXTURE(ScopedIdentifier, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "Scope::helloWorld1234", "test", "tlisp");
        TEST_ASSERT_EQUALS(1, sysbvm_arraySlice_getSize(tokenList));
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_IDENTIFIER, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "Scope::helloWorld1234"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 0)));
    }

    TEST_CASE_WITH_FIXTURE(ScopedIdentifier2, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "Scope::SubScope::helloWorld1234", "test", "tlisp");
        TEST_ASSERT_EQUALS(1, sysbvm_arraySlice_getSize(tokenList));
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_IDENTIFIER, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "Scope::SubScope::helloWorld1234"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 0)));
    }

    TEST_CASE_WITH_FIXTURE(Operator, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "+", "test", "tlisp");
        TEST_ASSERT_EQUALS(1, sysbvm_arraySlice_getSize(tokenList));
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_OPERATOR, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "+"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 0)));
    }

    TEST_CASE_WITH_FIXTURE(Operator2, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "||", "test", "tlisp");
        TEST_ASSERT_EQUALS(1, sysbvm_arraySlice_getSize(tokenList));
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_OPERATOR, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "||"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 0)));
    }

    TEST_CASE_WITH_FIXTURE(ScopedOperator, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "Scope::+", "test", "tlisp");
        TEST_ASSERT_EQUALS(1, sysbvm_arraySlice_getSize(tokenList));
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_OPERATOR, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "Scope::+"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 0)));
    }

    TEST_CASE_WITH_FIXTURE(ScopedOperator2, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "Scope::SubScope::+", "test", "tlisp");
        TEST_ASSERT_EQUALS(1, sysbvm_arraySlice_getSize(tokenList));
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_OPERATOR, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "Scope::SubScope::+"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 0)));
    }

    TEST_CASE_WITH_FIXTURE(Keyword, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "test:", "test", "tlisp");
        TEST_ASSERT_EQUALS(1, sysbvm_arraySlice_getSize(tokenList));
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_KEYWORD, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "test:"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 0)));
    }

    TEST_CASE_WITH_FIXTURE(ScopedKeyword, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "Scope::test:", "test", "tlisp");
        TEST_ASSERT_EQUALS(1, sysbvm_arraySlice_getSize(tokenList));
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_KEYWORD, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "Scope::test:"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 0)));
    }

    TEST_CASE_WITH_FIXTURE(MultiKeyword, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "test:second:", "test", "tlisp");
        TEST_ASSERT_EQUALS(1, sysbvm_arraySlice_getSize(tokenList));
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_MULTI_KEYWORD, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "test:second:"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 0)));
    }

    TEST_CASE_WITH_FIXTURE(ScopedMultiKeyword, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "Scope::test:second:", "test", "tlisp");
        TEST_ASSERT_EQUALS(1, sysbvm_arraySlice_getSize(tokenList));
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_MULTI_KEYWORD, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "Scope::test:second:"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 0)));
    }

    TEST_CASE_WITH_FIXTURE(IdentifierSymbol, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "#helloWorld1234", "test", "tlisp");
        TEST_ASSERT_EQUALS(1, sysbvm_arraySlice_getSize(tokenList));
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_SYMBOL, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "helloWorld1234"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 0)));
    }

    TEST_CASE_WITH_FIXTURE(IdentifierSymbol2, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "#Scope::helloWorld1234", "test", "tlisp");
        TEST_ASSERT_EQUALS(1, sysbvm_arraySlice_getSize(tokenList));
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_SYMBOL, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "Scope::helloWorld1234"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 0)));
    }

    TEST_CASE_WITH_FIXTURE(OperatorSymbol, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "#+", "test", "tlisp");
        TEST_ASSERT_EQUALS(1, sysbvm_arraySlice_getSize(tokenList));
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_SYMBOL, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "+"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 0)));
    }

    TEST_CASE_WITH_FIXTURE(OperatorSymbol2, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "#Scope::+", "test", "tlisp");
        TEST_ASSERT_EQUALS(1, sysbvm_arraySlice_getSize(tokenList));
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_SYMBOL, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "Scope::+"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 0)));
    }

    TEST_CASE_WITH_FIXTURE(Integer, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "12345", "test", "tlisp");
        TEST_ASSERT_EQUALS(1, sysbvm_arraySlice_getSize(tokenList));
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_INTEGER, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
    }


    TEST_CASE_WITH_FIXTURE(Integer2, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "12_345", "test", "tlisp");
        TEST_ASSERT_EQUALS(1, sysbvm_arraySlice_getSize(tokenList));
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_INTEGER, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
    }

    TEST_CASE_WITH_FIXTURE(IntegerWithRadix, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "16rFF00", "test", "tlisp");
        TEST_ASSERT_EQUALS(1, sysbvm_arraySlice_getSize(tokenList));
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_INTEGER, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
    }

    TEST_CASE_WITH_FIXTURE(IntegerWithRadix2, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "16rFF_00", "test", "tlisp");
        TEST_ASSERT_EQUALS(1, sysbvm_arraySlice_getSize(tokenList));
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_INTEGER, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
    }

    TEST_CASE_WITH_FIXTURE(Float, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "12345.0", "test", "tlisp");
        TEST_ASSERT_EQUALS(1, sysbvm_arraySlice_getSize(tokenList));
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_FLOAT, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
    }

    TEST_CASE_WITH_FIXTURE(Character, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "'T'", "test", "tlisp");
        TEST_ASSERT_EQUALS(1, sysbvm_arraySlice_getSize(tokenList));
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_CHARACTER, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
        TEST_ASSERT_EQUALS('T', sysbvm_tuple_char32_decode(sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 0))));
    }

    TEST_CASE_WITH_FIXTURE(String, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "\"Hello \\\"World\\r\\n\"", "test", "tlisp");
        TEST_ASSERT_EQUALS(1, sysbvm_arraySlice_getSize(tokenList));
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_STRING, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
        TEST_ASSERT(sysbvm_string_equals(sysbvm_string_createWithCString(sysbvm_test_context, "Hello \"World\r\n"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 0))));
    }

    TEST_CASE_WITH_FIXTURE(StringSymbol, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "#\"Hello \\\"World\\r\\n\"", "test", "tlisp");
        TEST_ASSERT_EQUALS(1, sysbvm_arraySlice_getSize(tokenList));
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_SYMBOL, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
        TEST_ASSERT(sysbvm_string_equals(sysbvm_string_createWithCString(sysbvm_test_context, "Hello \"World\r\n"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 0))));
    }

    TEST_CASE_WITH_FIXTURE(Delimiters, TuuvmCore)
    {
        sysbvm_tuple_t tokenList = sysbvm_scanner_scanCString(sysbvm_test_context, "() [] {} : :: `' `` `, `@ | .. ... ; * < >", "test", "tlisp");
        TEST_ASSERT_EQUALS(20, sysbvm_arraySlice_getSize(tokenList));
        
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_LPARENT, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 0)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "("), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 0)));

        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_RPARENT, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 1)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, ")"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 1)));

        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_LBRACKET, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 2)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "["), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 2)));

        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_RBRACKET, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 3)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "]"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 3)));

        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_LCBRACKET, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 4)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "{"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 4)));

        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_RCBRACKET, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 5)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "}"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 5)));

        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_COLON, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 6)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, ":"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 6)));

        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_COLON_COLON, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 7)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "::"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 7)));

        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_QUOTE, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 8)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "`'"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 8)));

        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_QUASI_QUOTE, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 9)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "``"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 9)));

        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_QUASI_UNQUOTE, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 10)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "`,"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 10)));
        
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_SPLICE, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 11)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "`@"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 11)));

        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_BAR, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 12)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "|"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 12)));

        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_DOT, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 13)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "."), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 13)));

        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_DOT, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 14)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "."), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 14)));

        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_ELLIPSIS, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 15)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "..."), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 15)));

        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_SEMICOLON, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 16)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, ";"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 16)));
 
        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_STAR, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 17)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "*"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 17)));

        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_LESS_THAN, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 18)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, "<"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 18)));

        TEST_ASSERT_EQUALS(SYSBVM_TOKEN_KIND_GREATER_THAN, sysbvm_token_getKind(sysbvm_arraySlice_at(tokenList, 19)));
        TEST_ASSERT_EQUALS(sysbvm_symbol_internWithCString(sysbvm_test_context, ">"), sysbvm_token_getValue(sysbvm_arraySlice_at(tokenList, 19)));
    }
}